

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

void __thiscall
icu_63::NFRuleSet::setBestFractionRule
          (NFRuleSet *this,int32_t originalIndex,NFRule *newRule,UBool rememberRule)

{
  char16_t cVar1;
  char16_t cVar2;
  DecimalFormatSymbols *pDVar3;
  UnicodeString UStack_68;
  
  if (rememberRule != '\0') {
    NFRuleList::add(&this->fractionRules,newRule);
  }
  if (this->nonNumericalRules[originalIndex] != (NFRule *)0x0) {
    pDVar3 = RuleBasedNumberFormat::getDecimalFormatSymbols(this->owner);
    UnicodeString::UnicodeString(&UStack_68,(UnicodeString *)&pDVar3->field_0x8);
    cVar2 = UnicodeString::doCharAt(&UStack_68,0);
    cVar1 = newRule->decimalPoint;
    UnicodeString::~UnicodeString(&UStack_68);
    if (cVar2 != cVar1) {
      return;
    }
  }
  this->nonNumericalRules[originalIndex] = newRule;
  return;
}

Assistant:

void NFRuleSet::setBestFractionRule(int32_t originalIndex, NFRule *newRule, UBool rememberRule) {
    if (rememberRule) {
        fractionRules.add(newRule);
    }
    NFRule *bestResult = nonNumericalRules[originalIndex];
    if (bestResult == NULL) {
        nonNumericalRules[originalIndex] = newRule;
    }
    else {
        // We have more than one. Which one is better?
        const DecimalFormatSymbols *decimalFormatSymbols = owner->getDecimalFormatSymbols();
        if (decimalFormatSymbols->getSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol).charAt(0)
            == newRule->getDecimalPoint())
        {
            nonNumericalRules[originalIndex] = newRule;
        }
        // else leave it alone
    }
}